

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlDtdPtr xmlCreateIntSubset(xmlDocPtr doc,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  _xmlNode *p_Var1;
  xmlDtdPtr pxVar2;
  xmlChar *pxVar3;
  _xmlNode **pp_Var4;
  xmlRegisterNodeFunc *pp_Var5;
  _xmlNode *p_Var6;
  _xmlNode **pp_Var7;
  
  if (doc != (xmlDocPtr)0x0) {
    for (p_Var6 = doc->children; p_Var6 != (_xmlNode *)0x0; p_Var6 = p_Var6->next) {
      if (p_Var6->type == XML_DTD_NODE) {
        return (xmlDtdPtr)0x0;
      }
    }
    if (doc->intSubset != (_xmlDtd *)0x0) {
      return (xmlDtdPtr)0x0;
    }
  }
  pxVar2 = (xmlDtdPtr)(*xmlMalloc)(0x80);
  if (pxVar2 == (xmlDtdPtr)0x0) {
    __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"building internal subset");
    return (xmlDtdPtr)0x0;
  }
  pxVar2->_private = (void *)0x0;
  *(undefined8 *)&pxVar2->type = 0;
  pxVar2->SystemID = (xmlChar *)0x0;
  pxVar2->pentities = (void *)0x0;
  pxVar2->entities = (xmlNs *)0x0;
  pxVar2->ExternalID = (xmlChar *)0x0;
  pxVar2->elements = (xmlChar *)0x0;
  pxVar2->attributes = (_xmlAttr *)0x0;
  pxVar2->doc = (_xmlDoc *)0x0;
  pxVar2->notations = (xmlNs *)0x0;
  pxVar2->next = (_xmlNode *)0x0;
  pxVar2->prev = (_xmlNode *)0x0;
  pxVar2->last = (_xmlNode *)0x0;
  pxVar2->parent = (_xmlDoc *)0x0;
  pxVar2->name = (xmlChar *)0x0;
  pxVar2->children = (_xmlNode *)0x0;
  pxVar2->type = XML_DTD_NODE;
  if (name != (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(name);
    pxVar2->name = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) {
      __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"building internal subset");
      goto LAB_00186215;
    }
  }
  if (ExternalID != (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(ExternalID);
    pxVar2->ExternalID = pxVar3;
    if (pxVar3 != (xmlChar *)0x0) goto LAB_001860f6;
    __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"building internal subset");
    pxVar3 = pxVar2->name;
LAB_00186207:
    if (pxVar3 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar3);
    }
LAB_00186215:
    (*xmlFree)(pxVar2);
    return (xmlDtdPtr)0x0;
  }
LAB_001860f6:
  if (SystemID != (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(SystemID);
    pxVar2->SystemID = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) {
      __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"building internal subset");
      if (pxVar2->name != (xmlChar *)0x0) {
        (*xmlFree)(pxVar2->name);
      }
      pxVar3 = pxVar2->ExternalID;
      goto LAB_00186207;
    }
  }
  if (doc == (xmlDocPtr)0x0) goto LAB_00186261;
  doc->intSubset = pxVar2;
  pxVar2->parent = doc;
  pxVar2->doc = doc;
  p_Var6 = doc->children;
  if (p_Var6 == (_xmlNode *)0x0) {
    doc->children = (_xmlNode *)pxVar2;
LAB_00186238:
    pp_Var4 = &doc->last;
  }
  else {
    if (doc->type != XML_HTML_DOCUMENT_NODE) {
      do {
        if (p_Var6->type == XML_ELEMENT_NODE) {
          pxVar2->next = p_Var6;
          p_Var1 = p_Var6->prev;
          pp_Var4 = &p_Var6->prev;
          pxVar2->prev = p_Var1;
          pp_Var7 = &p_Var1->next;
          if (p_Var1 == (_xmlNode *)0x0) {
            pp_Var7 = &doc->children;
          }
          *pp_Var7 = (_xmlNode *)pxVar2;
          goto LAB_0018625e;
        }
        p_Var6 = p_Var6->next;
      } while (p_Var6 != (_xmlNode *)0x0);
      p_Var6 = doc->last;
      pxVar2->prev = p_Var6;
      p_Var6->next = (_xmlNode *)pxVar2;
      pxVar2->next = (_xmlNode *)0x0;
      goto LAB_00186238;
    }
    p_Var6->prev = (_xmlNode *)pxVar2;
    pxVar2->next = p_Var6;
    pp_Var4 = &doc->children;
  }
LAB_0018625e:
  *pp_Var4 = (_xmlNode *)pxVar2;
LAB_00186261:
  if (__xmlRegisterCallbacks == 0) {
    return pxVar2;
  }
  pp_Var5 = __xmlRegisterNodeDefaultValue();
  if (*pp_Var5 != (xmlRegisterNodeFunc)0x0) {
    pp_Var5 = __xmlRegisterNodeDefaultValue();
    (**pp_Var5)((xmlNodePtr)pxVar2);
    return pxVar2;
  }
  return pxVar2;
}

Assistant:

xmlDtdPtr
xmlCreateIntSubset(xmlDocPtr doc, const xmlChar *name,
                   const xmlChar *ExternalID, const xmlChar *SystemID) {
    xmlDtdPtr cur;

    if ((doc != NULL) && (xmlGetIntSubset(doc) != NULL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,

     "xmlCreateIntSubset(): document %s already have an internal subset\n",
	    doc->name);
#endif
	return(NULL);
    }

    /*
     * Allocate a new DTD and fill the fields.
     */
    cur = (xmlDtdPtr) xmlMalloc(sizeof(xmlDtd));
    if (cur == NULL) {
	xmlTreeErrMemory("building internal subset");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlDtd));
    cur->type = XML_DTD_NODE;

    if (name != NULL) {
	cur->name = xmlStrdup(name);
	if (cur->name == NULL) {
	    xmlTreeErrMemory("building internal subset");
	    xmlFree(cur);
	    return(NULL);
	}
    }
    if (ExternalID != NULL) {
	cur->ExternalID = xmlStrdup(ExternalID);
	if (cur->ExternalID  == NULL) {
	    xmlTreeErrMemory("building internal subset");
	    if (cur->name != NULL)
	        xmlFree((char *)cur->name);
	    xmlFree(cur);
	    return(NULL);
	}
    }
    if (SystemID != NULL) {
	cur->SystemID = xmlStrdup(SystemID);
	if (cur->SystemID == NULL) {
	    xmlTreeErrMemory("building internal subset");
	    if (cur->name != NULL)
	        xmlFree((char *)cur->name);
	    if (cur->ExternalID != NULL)
	        xmlFree((char *)cur->ExternalID);
	    xmlFree(cur);
	    return(NULL);
	}
    }
    if (doc != NULL) {
	doc->intSubset = cur;
	cur->parent = doc;
	cur->doc = doc;
	if (doc->children == NULL) {
	    doc->children = (xmlNodePtr) cur;
	    doc->last = (xmlNodePtr) cur;
	} else {
	    if (doc->type == XML_HTML_DOCUMENT_NODE) {
		xmlNodePtr prev;

		prev = doc->children;
		prev->prev = (xmlNodePtr) cur;
		cur->next = prev;
		doc->children = (xmlNodePtr) cur;
	    } else {
		xmlNodePtr next;

		next = doc->children;
		while ((next != NULL) && (next->type != XML_ELEMENT_NODE))
		    next = next->next;
		if (next == NULL) {
		    cur->prev = doc->last;
		    cur->prev->next = (xmlNodePtr) cur;
		    cur->next = NULL;
		    doc->last = (xmlNodePtr) cur;
		} else {
		    cur->next = next;
		    cur->prev = next->prev;
		    if (cur->prev == NULL)
			doc->children = (xmlNodePtr) cur;
		    else
			cur->prev->next = (xmlNodePtr) cur;
		    next->prev = (xmlNodePtr) cur;
		}
	    }
	}
    }

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);
}